

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

int untrap(boolean force)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  boolean bVar4;
  char cVar5;
  schar sVar6;
  xchar xVar7;
  int iVar8;
  int y_00;
  uint uVar9;
  int iVar10;
  trap *ptVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  bool bVar15;
  int local_24c;
  monst *local_240;
  monst *local_218;
  schar local_1cf;
  char local_1ce;
  char local_1cd;
  int local_1cc;
  char local_1c8;
  schar dz;
  schar dy;
  schar dx;
  int containercnt;
  char qbuf [128];
  char the_trap [256];
  boolean deal_with_floor_trap;
  boolean box_here;
  boolean trap_skipped;
  monst *mtmp;
  trap *ttmp;
  int ch;
  int y;
  int x;
  boolean confused;
  obj *otmp;
  boolean force_local;
  
  bVar15 = true;
  if ((u.uprops[0x1c].intrinsic == 0) && (bVar15 = false, u.uprops[0x23].intrinsic != 0)) {
    bVar15 = true;
    if ((u.uprops[0x24].extrinsic == 0) && (bVar15 = false, u.umonnum != u.umonster)) {
      bVar4 = dmgtype(youmonst.data,0x24);
      bVar15 = bVar4 != '\0';
    }
    bVar15 = (bool)(bVar15 ^ 1);
  }
  bVar3 = false;
  bVar1 = false;
  local_1cc = 0;
  iVar8 = getdir((char *)0x0,&local_1cd,&local_1ce,&local_1cf);
  if (iVar8 == 0) {
    return 0;
  }
  iVar8 = (int)u.ux + (int)local_1cd;
  y_00 = (int)u.uy + (int)local_1ce;
  for (_x = level->objects[iVar8][y_00]; _x != (obj *)0x0; _x = (_x->v).v_nexthere) {
    if ((((_x->otyp == 0xda) || (_x->otyp == 0xdb)) || (_x->otyp == 0xdc)) &&
       ((local_1cd == '\0' && (local_1ce == '\0')))) {
      bVar1 = true;
      local_1cc = local_1cc + 1;
      if (1 < local_1cc) break;
    }
  }
  ptVar11 = t_at(level,iVar8,y_00);
  if ((ptVar11 != (trap *)0x0) && (((byte)ptVar11->field_0x8 >> 5 & 1) != 0)) {
    bVar2 = true;
    pcVar12 = the(trapexplain[(int)((ptVar11->field_0x8 & 0x1f) - 1)]);
    strcpy(qbuf + 0x78,pcVar12);
    if (bVar1) {
      if (((ptVar11->field_0x8 & 0x1f) == 0xb) || ((ptVar11->field_0x8 & 0x1f) == 0xc)) {
        pcVar12 = " while standing on the edge of it";
        if (u.utrap != 0) {
          pcVar12 = " that you\'re stuck in";
        }
        pline("You can\'t do much about %s%s.",qbuf + 0x78,pcVar12);
        bVar3 = true;
        bVar2 = false;
      }
      else {
        pcVar12 = "are containers";
        if (local_1cc == 1) {
          pcVar12 = "is a container";
        }
        pcVar13 = an(defexplain[(ulong)((byte)ptVar11->field_0x8 & 0x1f) + 0x2f]);
        pcVar14 = "Disarm";
        if ((ptVar11->field_0x8 & 0x1f) == 0x13) {
          pcVar14 = "Remove";
        }
        sprintf(&local_1c8,"There %s and %s here. %s %s?",pcVar12,pcVar13,pcVar14,qbuf + 0x78);
        cVar5 = yn_function(&local_1c8,"ynq",'q');
        if (cVar5 == 'n') {
          bVar3 = true;
          bVar2 = false;
        }
        else if (cVar5 == 'q') {
          return 0;
        }
      }
    }
    if (bVar2) {
      if (u.utrap != 0) {
        pcVar12 = "";
        if (iVar8 == u.ux && y_00 == u.uy) {
          pcVar12 = " in it";
        }
        pline("You cannot deal with %s while trapped%s!",qbuf + 0x78,pcVar12);
        return 1;
      }
      switch(ptVar11->field_0x8 & 0x1f) {
      case 1:
        iVar8 = disarm_shooting_trap(ptVar11,1,local_1cd,local_1ce);
        return iVar8;
      case 2:
        iVar8 = disarm_shooting_trap(ptVar11,7,local_1cd,local_1ce);
        return iVar8;
      default:
        pcVar12 = "this";
        if (local_1cd != '\0' || local_1ce != '\0') {
          pcVar12 = "that";
        }
        pline("You cannot disable %s trap.",pcVar12);
        return 0;
      case 4:
        iVar8 = disarm_squeaky_board(ptVar11,local_1cd,local_1ce);
        return iVar8;
      case 5:
      case 0x13:
        iVar8 = disarm_holdingtrap(ptVar11,local_1cd,local_1ce);
        return iVar8;
      case 6:
        iVar8 = disarm_landmine(ptVar11,local_1cd,local_1ce);
        return iVar8;
      case 0xb:
      case 0xc:
        goto switchD_003132ff_caseD_b;
      case 0x18:
        iVar8 = disarm_shooting_trap(ptVar11,8,local_1cd,local_1ce);
        return iVar8;
      }
    }
  }
  if ((local_1cd == '\0') && (local_1ce == '\0')) {
    _x = level->objects[iVar8][y_00];
    do {
      if (_x == (obj *)0x0) {
        pcVar12 = "You know of no traps here.";
        if (bVar3) {
          pcVar12 = "You find no other traps here.";
        }
        pline(pcVar12);
        return 0;
      }
      if (((_x->otyp == 0xda) || (_x->otyp == 0xdb)) || (_x->otyp == 0xdc)) {
        pcVar12 = doname(_x);
        pcVar13 = simple_typename((int)_x->otyp);
        pcVar13 = an(pcVar13);
        pcVar12 = safe_qbuf("",0x24,pcVar12,pcVar13,"a box");
        sprintf(&local_1c8,"There is %s here. Check it for traps?",pcVar12);
        cVar5 = yn_function(&local_1c8,"ynq",'q');
        if (cVar5 != 'n') {
          if (cVar5 == 'q') {
            return 0;
          }
          if ((u.usteed != (monst *)0x0) && (u.weapon_skills[0x27].skill < '\x02')) {
            pcVar12 = mon_nam(u.usteed);
            pline("You aren\'t skilled enough to reach from %s.",pcVar12);
            return 0;
          }
          if ((((*(uint *)&_x->field_0x4a >> 0xf & 1) == 0) ||
              ((force == '\0' && ((bVar15 || (iVar8 = rn2(0x1f - u.ulevel), 9 < iVar8)))))) &&
             ((force != '\0' || ((!bVar15 || (iVar8 = rn2(3), iVar8 != 0)))))) {
            pcVar12 = xname(_x);
            pcVar12 = the(pcVar12);
            pline("You find no traps on %s.",pcVar12);
            return 1;
          }
          pcVar12 = xname(_x);
          pcVar12 = the(pcVar12);
          pline("You find a trap on %s!",pcVar12);
          if (!bVar15) {
            exercise(2,'\x01');
          }
          cVar5 = yn_function("Disarm it?","ynq",'q');
          if (cVar5 != 'n') {
            if (cVar5 == 'q') {
              return 1;
            }
            if ((*(uint *)&_x->field_0x4a >> 0xf & 1) == 0) {
              pcVar12 = xname(_x);
              pline("That %s was not trapped.",pcVar12);
              return 1;
            }
            exercise(3,'\x01');
            sVar6 = acurr(3);
            ttmp._0_4_ = sVar6 + u.ulevel;
            if (urole.malenum == 0x164) {
              ttmp._0_4_ = (int)ttmp * 2;
            }
            if (force == '\0') {
              if (((!bVar15) && (u.uprops[0x25].intrinsic == 0)) && (u.uprops[0x25].extrinsic == 0))
              {
                xVar7 = level_difficulty(&u.uz);
                iVar8 = rnd((int)xVar7 / 2 + 0x4b);
                if (iVar8 <= (int)ttmp) goto LAB_00313866;
              }
              chest_trap(_x,3,'\x01');
            }
            else {
LAB_00313866:
              pline("You disarm it!");
              *(uint *)&_x->field_0x4a = *(uint *)&_x->field_0x4a & 0xffff7fff;
            }
            return 1;
          }
          bVar3 = true;
        }
      }
      _x = (_x->v).v_nexthere;
    } while( true );
  }
  if ((level->monsters[iVar8][y_00] == (monst *)0x0) ||
     ((*(uint *)&level->monsters[iVar8][y_00]->field_0x60 >> 9 & 1) != 0)) {
    local_240 = (monst *)0x0;
  }
  else {
    local_240 = level->monsters[iVar8][y_00];
  }
  if ((((local_240 != (monst *)0x0) && (local_240->m_ap_type == '\x01')) &&
      ((local_240->mappearance == 0x1c || (local_240->mappearance == 0x1b)))) &&
     ((u.uprops[0x17].intrinsic == 0 && (u.uprops[0x17].extrinsic == 0)))) {
    stumble_onto_mimic(local_240,local_1cd,local_1ce);
    return 1;
  }
  if (level->locations[iVar8][y_00].typ != '\x17') {
    ptVar11 = t_at(level,iVar8,y_00);
    if ((ptVar11 == (trap *)0x0) || (((byte)ptVar11->field_0x8 >> 5 & 1) == 0)) {
      pline("You know of no traps there.");
    }
    else {
      pline("You cannot disable that trap.");
    }
    return 0;
  }
  uVar9 = *(uint *)&level->locations[iVar8][y_00].field_0x6 >> 4 & 0x1f;
  if (uVar9 == 0) {
    if ((u.uprops[0x1e].intrinsic != 0) ||
       (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
        (bVar15 = false, ((youmonst.data)->mflags1 & 0x1000) != 0)))) {
      bVar15 = false;
      if (ublindf != (obj *)0x0) {
        bVar15 = ublindf->oartifact == '\x1d';
      }
      bVar15 = (bool)(bVar15 ^ 1);
    }
    pcVar12 = "not see";
    if (bVar15) {
      pcVar12 = "You feel";
    }
    pline("You %s no door there.",pcVar12 + 4);
    return 0;
  }
  if (uVar9 == 1) {
    pline("This door is broken.");
    return 0;
  }
  if (uVar9 == 2) {
    pline("This door is safely open.");
    return 0;
  }
  if ((((*(uint *)&level->locations[iVar8][y_00].field_0x6 >> 4 & 0x10) == 0) ||
      ((force == '\0' && ((bVar15 || (iVar10 = rn2(0x29 - u.ulevel), 9 < iVar10)))))) &&
     ((force != '\0' || ((!bVar15 || (iVar10 = rn2(3), iVar10 != 0)))))) {
    pline("You find no traps on the door.");
    return 1;
  }
  pline("You find a trap on the door!");
  exercise(2,'\x01');
  cVar5 = yn_function("Disarm it?","ynq",'q');
  if (cVar5 != 'y') {
    return 1;
  }
  if ((*(uint *)&level->locations[iVar8][y_00].field_0x6 >> 4 & 0x10) == 0) {
    pline("This door was not trapped.");
    return 1;
  }
  if (urole.malenum == 0x164) {
    local_24c = u.ulevel * 3;
  }
  else {
    local_24c = u.ulevel;
  }
  exercise(3,'\x01');
  if (force == '\0') {
    if (((!bVar15) && (u.uprops[0x25].intrinsic == 0)) && (u.uprops[0x25].extrinsic == 0)) {
      xVar7 = level_difficulty(&u.uz);
      iVar10 = rnd((int)xVar7 / 2 + 0x4b);
      if (iVar10 <= local_24c + 0xf) goto LAB_00313e7c;
    }
    pline("You set it off!");
    b_trapped("door",3);
    *(uint *)&level->locations[iVar8][y_00].field_0x6 =
         *(uint *)&level->locations[iVar8][y_00].field_0x6 & 0xfffffe0f;
    unblock_point(iVar8,y_00);
    newsym(iVar8,y_00);
    pcVar12 = in_rooms(level,(xchar)iVar8,(xchar)y_00,0x12);
    if (*pcVar12 != '\0') {
      add_damage((xchar)iVar8,(xchar)y_00,0);
    }
  }
  else {
LAB_00313e7c:
    pline("You disarm it!");
    *(uint *)&level->locations[iVar8][y_00].field_0x6 =
         *(uint *)&level->locations[iVar8][y_00].field_0x6 & 0xfffffe0f |
         (*(uint *)&level->locations[iVar8][y_00].field_0x6 >> 4 & 0xf) << 4;
  }
  return 1;
switchD_003132ff_caseD_b:
  if ((local_1cd == '\0') && (local_1ce == '\0')) {
    pline("You are already on the edge of the pit.");
    return 0;
  }
  if ((level->monsters[iVar8][y_00] == (monst *)0x0) ||
     ((*(uint *)&level->monsters[iVar8][y_00]->field_0x60 >> 9 & 1) != 0)) {
    local_218 = (monst *)0x0;
  }
  else {
    local_218 = level->monsters[iVar8][y_00];
  }
  if (local_218 != (monst *)0x0) {
    iVar8 = help_monster_out(local_218,ptVar11);
    return iVar8;
  }
  pline("Try filling the pit instead.");
  return 0;
}

Assistant:

int untrap(boolean force)
{
	struct obj *otmp;
	boolean confused = (Confusion > 0 || Hallucination > 0);
	int x,y;
	int ch;
	struct trap *ttmp;
	struct monst *mtmp;
	boolean trap_skipped = FALSE;
	boolean box_here = FALSE;
	boolean deal_with_floor_trap = FALSE;
	char the_trap[BUFSZ], qbuf[QBUFSZ];
	int containercnt = 0;
	schar dx, dy, dz;

	if (!getdir(NULL, &dx, &dy, &dz))
	    return 0;
	x = u.ux + dx;
	y = u.uy + dy;

	for (otmp = level->objects[x][y]; otmp; otmp = otmp->nexthere) {
		if (Is_box(otmp) && !dx && !dy) {
			box_here = TRUE;
			containercnt++;
			if (containercnt > 1) break;
		}
	}

	if ((ttmp = t_at(level, x,y)) && ttmp->tseen) {
		deal_with_floor_trap = TRUE;
		strcpy(the_trap, the(trapexplain[ttmp->ttyp-1]));
		if (box_here) {
			if (ttmp->ttyp == PIT || ttmp->ttyp == SPIKED_PIT) {
			    pline("You can't do much about %s%s.",
					the_trap, u.utrap ?
					" that you're stuck in" :
					" while standing on the edge of it");
			    trap_skipped = TRUE;
			    deal_with_floor_trap = FALSE;
			} else {
			    sprintf(qbuf, "There %s and %s here. %s %s?",
				(containercnt == 1) ? "is a container" : "are containers",
				an(trapexplain[ttmp->ttyp-1]),
				ttmp->ttyp == WEB ? "Remove" : "Disarm", the_trap);
			    switch (ynq(qbuf)) {
				case 'q': return 0;
				case 'n': trap_skipped = TRUE;
					  deal_with_floor_trap = FALSE;
					  break;
			    }
			}
		}
		if (deal_with_floor_trap) {
		    if (u.utrap) {
			pline("You cannot deal with %s while trapped%s!", the_trap,
				(x == u.ux && y == u.uy) ? " in it" : "");
			return 1;
		    }
		    switch(ttmp->ttyp) {
			case BEAR_TRAP:
			case WEB:
				return disarm_holdingtrap(ttmp, dx, dy);
			case LANDMINE:
				return disarm_landmine(ttmp, dx, dy);
			case SQKY_BOARD:
				return disarm_squeaky_board(ttmp, dx, dy);
			case DART_TRAP:
				return disarm_shooting_trap(ttmp, DART, dx, dy);
			case SHURIKEN_TRAP:
				return disarm_shooting_trap(ttmp, SHURIKEN, dx, dy);
			case ARROW_TRAP:
				return disarm_shooting_trap(ttmp, ARROW, dx, dy);
			case PIT:
			case SPIKED_PIT:
				if (!dx && !dy) {
				    pline("You are already on the edge of the pit.");
				    return 0;
				}
				if (!(mtmp = m_at(level, x,y))) {
				    pline("Try filling the pit instead.");
				    return 0;
				}
				return help_monster_out(mtmp, ttmp);
			default:
				pline("You cannot disable %s trap.", (dx || dy) ? "that" : "this");
				return 0;
		    }
		}
	} /* end if */

	if (!dx && !dy) {
	    for (otmp = level->objects[x][y]; otmp; otmp = otmp->nexthere)
		if (Is_box(otmp)) {
		    sprintf(qbuf, "There is %s here. Check it for traps?",
			safe_qbuf("", sizeof("There is  here. Check it for traps?"),
				doname(otmp), an(simple_typename(otmp->otyp)), "a box"));
		    switch (ynq(qbuf)) {
			case 'q': return 0;
			case 'n': continue;
		    }
		    if (u.usteed && P_SKILL(P_RIDING) < P_BASIC) {
			pline("You aren't skilled enough to reach from %s.",
				mon_nam(u.usteed));
			return 0;
		    }
		    if ((otmp->otrapped && (force || (!confused
				&& rn2(MAXULEV + 1 - u.ulevel) < 10)))
		       || (!force && confused && !rn2(3))) {
			pline("You find a trap on %s!", the(xname(otmp)));
			if (!confused) exercise(A_WIS, TRUE);

			switch (ynq("Disarm it?")) {
			    case 'q': return 1;
			    case 'n': trap_skipped = TRUE;  continue;
			}

			if (otmp->otrapped) {
			    exercise(A_DEX, TRUE);
			    ch = ACURR(A_DEX) + u.ulevel;
			    if (Role_if (PM_ROGUE)) ch *= 2;
			    if (!force && (confused || Fumbling ||
				rnd(75 + level_difficulty(&u.uz) / 2) > ch)) {
				chest_trap(otmp, FINGER, TRUE);
			    } else {
				pline("You disarm it!");
				otmp->otrapped = 0;
			    }
			} else pline("That %s was not trapped.", xname(otmp));
			return 1;
		    } else {
			pline("You find no traps on %s.", the(xname(otmp)));
			return 1;
		    }
		}

	    pline(trap_skipped ? "You find no other traps here."
			       : "You know of no traps here.");
	    return 0;
	}

	if ((mtmp = m_at(level, x,y))			&&
		mtmp->m_ap_type == M_AP_FURNITURE	&&
		(mtmp->mappearance == S_hcdoor ||
			mtmp->mappearance == S_vcdoor)	&&
		!Protection_from_shape_changers)	 {

	    stumble_onto_mimic(mtmp, dx, dy);
	    return 1;
	}

	if (!IS_DOOR(level->locations[x][y].typ)) {
	    if ((ttmp = t_at(level, x,y)) && ttmp->tseen)
		pline("You cannot disable that trap.");
	    else
		pline("You know of no traps there.");
	    return 0;
	}

	switch (level->locations[x][y].doormask) {
	    case D_NODOOR:
		pline("You %s no door there.", Blind ? "feel" : "see");
		return 0;
	    case D_ISOPEN:
		pline("This door is safely open.");
		return 0;
	    case D_BROKEN:
		pline("This door is broken.");
		return 0;
	}

	if ((level->locations[x][y].doormask & D_TRAPPED
	     && (force ||
		 (!confused && rn2(MAXULEV - u.ulevel + 11) < 10)))
	    || (!force && confused && !rn2(3))) {
		pline("You find a trap on the door!");
		exercise(A_WIS, TRUE);
		if (ynq("Disarm it?") != 'y') return 1;
		if (level->locations[x][y].doormask & D_TRAPPED) {
		    ch = 15 + (Role_if (PM_ROGUE) ? u.ulevel*3 : u.ulevel);
		    exercise(A_DEX, TRUE);
		    if (!force && (confused || Fumbling ||
				     rnd(75 + level_difficulty(&u.uz) / 2) > ch)) {
			pline("You set it off!");
			b_trapped("door", FINGER);
			level->locations[x][y].doormask = D_NODOOR;
			unblock_point(x, y);
			newsym(x, y);
			/* (probably ought to charge for this damage...) */
			if (*in_rooms(level, x, y, SHOPBASE)) add_damage(x, y, 0L);
		    } else {
			pline("You disarm it!");
			level->locations[x][y].doormask &= ~D_TRAPPED;
		    }
		} else pline("This door was not trapped.");
		return 1;
	} else {
		pline("You find no traps on the door.");
		return 1;
	}
}